

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::IsPointWithinElement(Element *this,Vector2f point)

{
  float fVar1;
  int iVar2;
  Box *this_00;
  Vector2<float> VVar3;
  Vector2f VVar4;
  float local_58;
  float fStack_54;
  Vector2f box_dimensions;
  float local_48;
  float fStack_44;
  Vector2f box_position;
  Box *box;
  Vector2f box_offset;
  int i;
  Vector2f position;
  Element *this_local;
  float fStack_10;
  Vector2f point_local;
  
  register0x00001200 = GetAbsoluteOffset(this,Border);
  box_offset.x = 0.0;
  do {
    fVar1 = box_offset.x;
    iVar2 = GetNumBoxes(this);
    if (iVar2 <= (int)fVar1) {
      return false;
    }
    Vector2<float>::Vector2((Vector2<float> *)((long)&box + 4));
    this_00 = GetBox(this,(int)box_offset.x,(Vector2<float> *)((long)&box + 4));
    VVar3 = Vector2<float>::operator+((Vector2<float> *)&box_offset.y,stack0xffffffffffffffcc);
    VVar4 = Box::GetSize(this_00,Border);
    this_local._4_4_ = point.x;
    local_48 = VVar3.x;
    if ((local_48 <= this_local._4_4_) &&
       (local_58 = VVar4.x, this_local._4_4_ <= local_48 + local_58)) {
      fStack_10 = point.y;
      fStack_44 = VVar3.y;
      if ((fStack_44 <= fStack_10) && (fStack_54 = VVar4.y, fStack_10 <= fStack_44 + fStack_54)) {
        return true;
      }
    }
    box_offset.x = (float)((int)box_offset.x + 1);
  } while( true );
}

Assistant:

bool Element::IsPointWithinElement(const Vector2f point)
{
	const Vector2f position = GetAbsoluteOffset(BoxArea::Border);

	for (int i = 0; i < GetNumBoxes(); ++i)
	{
		Vector2f box_offset;
		const Box& box = GetBox(i, box_offset);

		const Vector2f box_position = position + box_offset;
		const Vector2f box_dimensions = box.GetSize(BoxArea::Border);
		if (point.x >= box_position.x && point.x <= (box_position.x + box_dimensions.x) && point.y >= box_position.y &&
			point.y <= (box_position.y + box_dimensions.y))
		{
			return true;
		}
	}

	return false;
}